

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# path.cpp
# Opt level: O0

iterator * __thiscall boost::filesystem::path::end(iterator *__return_storage_ptr__,path *this)

{
  size_type sVar1;
  path *this_local;
  iterator *itr;
  
  iterator::iterator(__return_storage_ptr__);
  __return_storage_ptr__->m_path_ptr = this;
  sVar1 = std::__cxx11::string::size();
  __return_storage_ptr__->m_pos = sVar1;
  return __return_storage_ptr__;
}

Assistant:

path::iterator path::end() const
  {
    iterator itr;
    itr.m_path_ptr = this;
    itr.m_pos = m_pathname.size();
    return itr;
  }